

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* buildLabelMap_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  long lVar3;
  LabelCommand *this;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  string local_50;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0;
  for (uVar6 = 0;
      psVar2 = (commands->
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(commands->
                            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar6 = uVar6 + 1) {
    lVar3 = *(long *)((long)&(psVar2->
                             super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar5);
    if (lVar3 != 0) {
      this = (LabelCommand *)
             __dynamic_cast(lVar3,&AssemblyCode::AssemblyCommand::typeinfo,
                            &AssemblyCode::LabelCommand::typeinfo,0);
      if (this != (LabelCommand *)0x0) {
        AssemblyCode::LabelCommand::getLabel_abi_cxx11_(&local_50,this);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](__return_storage_ptr__,&local_50);
        *pmVar4 = (mapped_type)uVar6;
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    lVar5 = lVar5 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, int> buildLabelMap(const AssemblyCommands &commands) {
    std::map<std::string, int> map;
    for (int i = 0; i < commands.size(); ++i) {
        const AssemblyCode::LabelCommand* labelCommand =
                dynamic_cast<const AssemblyCode::LabelCommand*>(commands[i].get());

        if (labelCommand != nullptr) {
            map[labelCommand->getLabel()] = i;
        }
    }

    return map;
}